

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O3

void __thiscall xe::ri::Section::~Section(Section *this)

{
  ~Section(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

~Section		(void) {}